

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

char * zt_cstr_sub(char *s,ssize_t i,ssize_t j)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar5 = 0;
    lVar6 = 0;
  }
  else {
    lVar4 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar4) {
      lVar4 = sVar1 - 1;
    }
    lVar6 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar6) {
      lVar6 = sVar1 - 1;
    }
    lVar5 = lVar6;
    if (lVar6 < lVar4) {
      lVar5 = lVar4;
    }
    if (lVar4 < lVar6) {
      lVar6 = lVar4;
    }
  }
  lVar2 = lVar6 - lVar5;
  lVar4 = -lVar2;
  if (0 < lVar2) {
    lVar4 = lVar2;
  }
  pcVar3 = (char *)zt_malloc_p(lVar4 + 2);
  for (lVar4 = 0; lVar6 + lVar4 <= lVar5; lVar4 = lVar4 + 1) {
    pcVar3[lVar4] = s[lVar4 + lVar6];
  }
  pcVar3[lVar4] = '\0';
  return pcVar3;
}

Assistant:

char *
zt_cstr_sub(const char *s, ssize_t i, ssize_t j) {
    char * new;
    char * p;

    CONVERT(s, i, j);

    new = zt_malloc(char, IDXLEN(i, j) + 1);

    p   = new;

    while (i <= j) {
        *p++ = s[i++];
    }
    *p  = '\0';
    return new;
}